

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

MOTION_MODE
motion_mode_allowed(WarpedMotionParams *gm_params,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,
                   int allow_warped_motion)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  byte bVar3;
  
  if (mbmi->overlappable_neighbors == '\0') {
    return '\0';
  }
  BVar1 = mbmi->bsize;
  if (xd->cur_frame_force_integer_mv == 0) {
    bVar3 = block_size_high[BVar1];
    if (block_size_wide[BVar1] < block_size_high[BVar1]) {
      bVar3 = block_size_wide[BVar1];
    }
    if (((1 < gm_params[mbmi->ref_frame[0]].wmtype) && ((mbmi->mode - 0xf & 0xf7) == 0)) &&
       (7 < bVar3)) {
      return '\0';
    }
  }
  else {
    bVar3 = block_size_high[BVar1];
    if (block_size_wide[BVar1] < block_size_high[BVar1]) {
      bVar3 = block_size_wide[BVar1];
    }
  }
  if (((bVar3 < 8) || ((byte)(mbmi->mode - 0x19) < 0xf4)) || (-1 < mbmi->ref_frame[1])) {
    return '\0';
  }
  if (((xd->cur_frame_force_integer_mv == 0) && (allow_warped_motion != 0)) &&
     ((mbmi->num_proj_ref != '\0' &&
      (iVar2 = av1_is_scaled(xd->block_ref_scale_factors[0]), iVar2 == 0)))) {
    return '\x02';
  }
  return '\x01';
}

Assistant:

static inline MOTION_MODE motion_mode_allowed(
    const WarpedMotionParams *gm_params, const MACROBLOCKD *xd,
    const MB_MODE_INFO *mbmi, int allow_warped_motion) {
  if (!check_num_overlappable_neighbors(mbmi)) return SIMPLE_TRANSLATION;
  if (xd->cur_frame_force_integer_mv == 0) {
    const TransformationType gm_type = gm_params[mbmi->ref_frame[0]].wmtype;
    if (is_global_mv_block(mbmi, gm_type)) return SIMPLE_TRANSLATION;
  }
  if (is_motion_variation_allowed_bsize(mbmi->bsize) &&
      is_inter_mode(mbmi->mode) && mbmi->ref_frame[1] != INTRA_FRAME &&
      is_motion_variation_allowed_compound(mbmi)) {
    assert(!has_second_ref(mbmi));
    if (mbmi->num_proj_ref >= 1 && allow_warped_motion &&
        !xd->cur_frame_force_integer_mv &&
        !av1_is_scaled(xd->block_ref_scale_factors[0])) {
      return WARPED_CAUSAL;
    }
    return OBMC_CAUSAL;
  }
  return SIMPLE_TRANSLATION;
}